

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O3

unsigned_long jsonnet::internal::jsonnet_string_parse_unicode(LocationRange *loc,char32_t *c)

{
  byte bVar1;
  unsigned_long uVar2;
  ostream *poVar3;
  StaticError *pSVar4;
  long lVar5;
  uint uVar6;
  stringstream ss;
  string local_1c8;
  undefined1 local_1a8 [392];
  
  lVar5 = 0;
  uVar2 = 0;
  do {
    bVar1 = (byte)c[lVar5];
    if (bVar1 == 0) {
      pSVar4 = (StaticError *)__cxa_allocate_exception(0x60);
      local_1a8._0_8_ = local_1a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Truncated unicode escape sequence in string literal.","");
      StaticError::StaticError(pSVar4,loc,(string *)local_1a8);
      __cxa_throw(pSVar4,&StaticError::typeinfo,StaticError::~StaticError);
    }
    uVar6 = bVar1 - 0x30;
    if (9 < uVar6) {
      if (bVar1 - 0x61 < 6) {
        uVar6 = bVar1 - 0x57;
      }
      else {
        if (5 < bVar1 - 0x41) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
          poVar3 = (ostream *)(local_1a8 + 0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,"Malformed unicode escape character, ",0x24);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"should be hex: \'",0x10);
          local_1c8._M_dataplus._M_p._0_1_ = bVar1;
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_1c8,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
          pSVar4 = (StaticError *)__cxa_allocate_exception(0x60);
          std::__cxx11::stringbuf::str();
          StaticError::StaticError(pSVar4,loc,&local_1c8);
          __cxa_throw(pSVar4,&StaticError::typeinfo,StaticError::~StaticError);
        }
        uVar6 = bVar1 - 0x37;
      }
    }
    uVar2 = (ulong)uVar6 + uVar2 * 0x10;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  return uVar2;
}

Assistant:

unsigned long jsonnet_string_parse_unicode(const LocationRange &loc, const char32_t *c)
{
    unsigned long codepoint = 0;
    // Expect 4 hex digits.
    for (unsigned i = 0; i < 4; ++i) {
        auto x = (unsigned char)(c[i]);
        unsigned digit;
        if (x == '\0') {
            auto msg = "Truncated unicode escape sequence in string literal.";
            throw StaticError(loc, msg);
        } else if (x >= '0' && x <= '9') {
            digit = x - '0';
        } else if (x >= 'a' && x <= 'f') {
            digit = x - 'a' + 10;
        } else if (x >= 'A' && x <= 'F') {
            digit = x - 'A' + 10;
        } else {
            std::stringstream ss;
            ss << "Malformed unicode escape character, "
               << "should be hex: '" << x << "'";
            throw StaticError(loc, ss.str());
        }
        codepoint *= 16;
        codepoint += digit;
    }
    return codepoint;
}